

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O2

Fl_Window * __thiscall Fl_Widget::top_window_offset(Fl_Widget *this,int *xoff,int *yoff)

{
  int iVar1;
  Fl_Window *pFVar2;
  undefined4 extraout_var;
  
  *yoff = 0;
  *xoff = 0;
  for (; (Fl_Window *)this != (Fl_Window *)0x0; this = (Fl_Widget *)window(this)) {
    pFVar2 = window(this);
    if (pFVar2 == (Fl_Window *)0x0) break;
    *xoff = *xoff + (((Fl_Window *)this)->super_Fl_Group).super_Fl_Widget.x_;
    *yoff = *yoff + (((Fl_Window *)this)->super_Fl_Group).super_Fl_Widget.y_;
  }
  iVar1 = (*(((Fl_Window *)this)->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[8])(this);
  return (Fl_Window *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Fl_Window* Fl_Widget::top_window_offset(int& xoff, int& yoff) const {
  xoff = yoff = 0;
  const Fl_Widget *w = this;
  while (w && w->window()) {
    xoff += w->x();			// accumulate offsets
    yoff += w->y();
    w = w->window();			// walk up window hierarchy
  }
  return const_cast<Fl_Widget*>(w)->as_window();
}